

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

mpack_node_data_t * mpack_node_map_str_impl(mpack_node_t node,char *str,size_t length)

{
  mpack_error_t mVar1;
  int iVar2;
  mpack_node_data_t *data;
  char *__s2;
  mpack_node_t node_00;
  mpack_node_data_t *key;
  size_t i;
  mpack_node_data_t *found;
  mpack_tree_t *tree;
  size_t length_local;
  char *str_local;
  mpack_node_t node_local;
  
  mVar1 = mpack_node_error(node);
  if (mVar1 == mpack_ok) {
    if ((node.data)->type == mpack_type_map) {
      i = 0;
      for (key = (mpack_node_data_t *)0x0; key < (mpack_node_data_t *)(ulong)(node.data)->len;
          key = (mpack_node_data_t *)((long)&key->type + 1)) {
        data = mpack_node_child(node,(long)key << 1);
        if ((data->type == mpack_type_str) && (data->len == length)) {
          node_00 = mpack_node(node.tree,data);
          __s2 = mpack_node_data_unchecked(node_00);
          iVar2 = memcmp(str,__s2,length);
          if (iVar2 == 0) {
            if (i != 0) {
              mpack_node_flag_error(node,mpack_error_data);
              return (mpack_node_data_t *)0x0;
            }
            i = (size_t)mpack_node_child(node,(long)key * 2 + 1);
          }
        }
      }
      if (i == 0) {
        node_local.tree = (mpack_tree_t *)0x0;
      }
      else {
        node_local.tree = (mpack_tree_t *)i;
      }
    }
    else {
      mpack_node_flag_error(node,mpack_error_type);
      node_local.tree = (mpack_tree_t *)0x0;
    }
  }
  else {
    node_local.tree = (mpack_tree_t *)0x0;
  }
  return (mpack_node_data_t *)node_local.tree;
}

Assistant:

static mpack_node_data_t* mpack_node_map_str_impl(mpack_node_t node, const char* str, size_t length) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    mpack_assert(length == 0 || str != NULL, "str of length %i is NULL", (int)length);

    if (node.data->type != mpack_type_map) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    mpack_tree_t* tree = node.tree;
    mpack_node_data_t* found = NULL;

    for (size_t i = 0; i < node.data->len; ++i) {
        mpack_node_data_t* key = mpack_node_child(node, i * 2);

        if (key->type == mpack_type_str && key->len == length &&
                mpack_memcmp(str, mpack_node_data_unchecked(mpack_node(tree, key)), length) == 0) {
            if (found) {
                mpack_node_flag_error(node, mpack_error_data);
                return NULL;
            }
            found = mpack_node_child(node, i * 2 + 1);
        }
    }

    if (found)
        return found;

    return NULL;
}